

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FtFont.h
# Opt level: O0

string * __thiscall
ft::Font::getFamilyNameOr(string *__return_storage_ptr__,Font *this,string *defaultName)

{
  char *pcVar1;
  allocator local_21;
  string *local_20;
  string *defaultName_local;
  Font *this_local;
  
  local_20 = defaultName;
  defaultName_local = (string *)this;
  this_local = (Font *)__return_storage_ptr__;
  if (this->face->family_name == (FT_String *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)defaultName);
  }
  else {
    pcVar1 = this->face->family_name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getFamilyNameOr(const std::string& defaultName) const
    {
        if (!face->family_name)
            return defaultName;
        return std::string(face->family_name);
    }